

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall
basisu::vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node>::erase
          (vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node> *this,
          uint32_t start,uint32_t n)

{
  tsvq_node *ptVar1;
  ulong uVar2;
  tsvq_node *this_00;
  long lVar3;
  
  uVar2 = (ulong)(this->m_size - (n + start));
  if (n + start <= this->m_size) {
    if (n != 0) {
      ptVar1 = this->m_p;
      this_00 = ptVar1 + start;
      for (lVar3 = uVar2 * 0x48; lVar3 != 0; lVar3 = lVar3 + -0x48) {
        tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node::operator=(this_00,this_00 + n);
        this_00 = this_00 + 1;
      }
      destruct_array<basisu::tree_vector_quant<basisu::vec<6u,float>>::tsvq_node>
                (ptVar1 + start + uVar2,(ulong)n);
      this->m_size = this->m_size - n;
    }
    return;
  }
  __assert_fail("(start + n) <= m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x2e3,
                "void basisu::vector<basisu::tree_vector_quant<basisu::vec<6, float>>::tsvq_node>::erase(uint32_t, uint32_t) [T = basisu::tree_vector_quant<basisu::vec<6, float>>::tsvq_node]"
               );
}

Assistant:

inline void erase(uint32_t start, uint32_t n)
      {
         assert((start + n) <= m_size);
         if ((start + n) > m_size)
            return;

         if (!n)
            return;

         const uint32_t num_to_move = m_size - (start + n);

         T* pDst = m_p + start;

         const T* pSrc = m_p + start + n;

         if (BASISU_IS_BITWISE_COPYABLE_OR_MOVABLE(T))
         {
            // This test is overly cautious.
            if ((!BASISU_IS_BITWISE_COPYABLE(T)) || (BASISU_HAS_DESTRUCTOR(T)))
            {
               // Type has been marked explictly as bitwise movable, which means we can move them around but they may need to be destructed.
               // First destroy the erased objects.
               scalar_type<T>::destruct_array(pDst, n);
            }

            // Copy "down" the objects to preserve, filling in the empty slots.
            memmove(pDst, pSrc, num_to_move * sizeof(T));
         }
         else
         {
            // Type is not bitwise copyable or movable. 
            // Move them down one at a time by using the equals operator, and destroying anything that's left over at the end.
            T* pDst_end = pDst + num_to_move;
            while (pDst != pDst_end)
               *pDst++ = *pSrc++;

            scalar_type<T>::destruct_array(pDst_end, n);
         }

         m_size -= n;
      }